

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O0

int secp256k1_eckey_pubkey_tweak_mul
              (secp256k1_ecmult_context *ctx,secp256k1_ge *key,secp256k1_scalar *tweak)

{
  int iVar1;
  undefined1 local_c8 [8];
  secp256k1_gej pt;
  secp256k1_scalar zero;
  secp256k1_scalar *tweak_local;
  secp256k1_ge *key_local;
  secp256k1_ecmult_context *ctx_local;
  
  iVar1 = secp256k1_scalar_is_zero(tweak);
  if (iVar1 == 0) {
    secp256k1_scalar_set_int((secp256k1_scalar *)&pt.infinity,0);
    secp256k1_gej_set_ge((secp256k1_gej *)local_c8,key);
    secp256k1_ecmult(ctx,(secp256k1_gej *)local_c8,(secp256k1_gej *)local_c8,tweak,
                     (secp256k1_scalar *)&pt.infinity);
    secp256k1_ge_set_gej(key,(secp256k1_gej *)local_c8);
  }
  ctx_local._4_4_ = (uint)(iVar1 == 0);
  return ctx_local._4_4_;
}

Assistant:

static int secp256k1_eckey_pubkey_tweak_mul(const secp256k1_ecmult_context *ctx, secp256k1_ge *key, const secp256k1_scalar *tweak) {
    secp256k1_scalar zero;
    secp256k1_gej pt;
    if (secp256k1_scalar_is_zero(tweak)) {
        return 0;
    }

    secp256k1_scalar_set_int(&zero, 0);
    secp256k1_gej_set_ge(&pt, key);
    secp256k1_ecmult(ctx, &pt, &pt, tweak, &zero);
    secp256k1_ge_set_gej(key, &pt);
    return 1;
}